

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.cpp
# Opt level: O2

int higan::Codec::HexCharToInt(char character)

{
  int iVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,character);
  if ((byte)(character + 0x9fU) < 6) {
    iVar1 = iVar2 + -0x57;
  }
  else if ((byte)(character + 0xbfU) < 6) {
    iVar1 = iVar2 + -0x37;
  }
  else {
    iVar1 = -1;
    if ((byte)(character - 0x30U) < 10) {
      iVar1 = iVar2 + -0x30;
    }
  }
  return iVar1;
}

Assistant:

int Codec::HexCharToInt(char character)
{
	int result = -1;
	if (character >= 'a' && character <= 'f')
	{
		result = character - 'a' + 10;
	}
	else if (character >= 'A' && character <= 'F')
	{
		result = character - 'A' + 10;
	}
	else if (character >= '0' && character <= '9')
	{
		result = character - '0';
	}
	return result;
}